

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::pair<int,_int>_>::setData
          (Parameter<std::pair<int,_int>_> *this,vector<double,_std::allocator<double>_> *pval)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  Parameter<std::pair<int,_int>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_00000010,in_stack_00000008);
  bVar1 = Parameter<std::pair<int,int>>::internalSetData<std::vector<double,std::allocator<double>>>
                    (in_stack_00000010,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffd0);
  return bVar1;
}

Assistant:

virtual bool setData(std::vector<RealType> pval) {
    return internalSetData<std::vector<RealType>>(pval);
  }